

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O0

void __thiscall
ObjTable<QPDFWriter::Object>::resize(ObjTable<QPDFWriter::Object> *this,size_t a_size)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  pointer ppVar4;
  reference pvVar5;
  pointer ppVar6;
  unsigned_long local_58;
  _Self local_28;
  iterator end;
  iterator it;
  size_t a_size_local;
  ObjTable<QPDFWriter::Object> *this_local;
  
  std::vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>::resize
            (&this->super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>,a_size);
  if (this->min_sparse < a_size) {
    end = std::
          map<unsigned_long,_QPDFWriter::Object,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFWriter::Object>_>_>
          ::begin(&this->sparse_elements);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_QPDFWriter::Object,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFWriter::Object>_>_>
         ::end(&this->sparse_elements);
    while( true ) {
      bVar2 = std::operator!=(&end,&local_28);
      bVar3 = false;
      if (bVar2) {
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_QPDFWriter::Object>_>::
                 operator->(&end);
        bVar3 = ppVar6->first < a_size;
      }
      if (!bVar3) break;
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_QPDFWriter::Object>_>::
               operator->(&end);
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_QPDFWriter::Object>_>::
               operator->(&end);
      pvVar5 = std::vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>::operator[]
                         (&this->
                           super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>,
                          ppVar4->first);
      iVar1 = (ppVar6->second).gen;
      pvVar5->renumber = (ppVar6->second).renumber;
      pvVar5->gen = iVar1;
      pvVar5->object_stream = (ppVar6->second).object_stream;
      end = std::
            map<unsigned_long,QPDFWriter::Object,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,QPDFWriter::Object>>>
            ::erase_abi_cxx11_((map<unsigned_long,QPDFWriter::Object,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,QPDFWriter::Object>>>
                                *)&this->sparse_elements,end);
    }
    bVar3 = std::operator==(&end,&local_28);
    if (bVar3) {
      local_58 = std::numeric_limits<unsigned_long>::max();
    }
    else {
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_QPDFWriter::Object>_>::
               operator->(&end);
      local_58 = ppVar6->first;
    }
    this->min_sparse = local_58;
  }
  return;
}

Assistant:

void
    resize(size_t a_size)
    {
        std::vector<T>::resize(a_size);
        if (a_size > min_sparse) {
            auto it = sparse_elements.begin();
            auto end = sparse_elements.end();
            while (it != end && it->first < a_size) {
                std::vector<T>::operator[](it->first) = std::move(it->second);
                it = sparse_elements.erase(it);
            }
            min_sparse = (it == end) ? std::numeric_limits<size_t>::max() : it->first;
        }
    }